

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O1

c_float vec_mean(c_float *a,c_int n)

{
  long lVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (0 < n) {
    lVar1 = 0;
    do {
      dVar2 = dVar2 + a[lVar1];
      lVar1 = lVar1 + 1;
    } while (n != lVar1);
  }
  return dVar2 / (double)n;
}

Assistant:

c_float vec_mean(const c_float *a, c_int n) {
  c_float mean = 0.0;
  c_int   i;

  for (i = 0; i < n; i++) {
    mean += a[i];
  }
  mean /= (c_float)n;

  return mean;
}